

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Platform.cpp
# Opt level: O0

void __thiscall tcu::x11::X11Platform::X11Platform(X11Platform *this)

{
  MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> local_40;
  MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> local_30 [2];
  X11Platform *local_10;
  X11Platform *this_local;
  
  local_10 = this;
  Platform::Platform(&this->super_Platform);
  (this->super_Platform)._vptr_Platform = (_func_int **)&PTR__X11Platform_0066ee30;
  EventState::EventState(&this->m_eventState);
  VulkanPlatform::VulkanPlatform(&this->m_vkPlatform,&this->m_eventState);
  x11::egl::Platform::Platform(&this->m_eglPlatform,&this->m_eventState);
  X11GLPlatform::X11GLPlatform(&this->m_glPlatform);
  glx::createContextFactory(local_30,&this->m_eventState);
  X11GLPlatform::registerFactory(&this->m_glPlatform,local_30);
  de::details::MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>::~MovePtr
            (local_30);
  x11::egl::Platform::createContextFactory(&local_40,&this->m_eglPlatform);
  X11GLPlatform::registerFactory(&this->m_glPlatform,&local_40);
  de::details::MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>::~MovePtr
            (&local_40);
  return;
}

Assistant:

X11Platform::X11Platform (void)
	: m_vkPlatform	(m_eventState)
	, m_eglPlatform	(m_eventState)
{
#if defined (DEQP_SUPPORT_GLX)
	m_glPlatform.registerFactory(glx::createContextFactory(m_eventState));
#endif // DEQP_SUPPORT_GLX

	m_glPlatform.registerFactory(m_eglPlatform.createContextFactory());
}